

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O1

void __thiscall
flatbuffers::BinaryAnnotator::BuildVector
          (BinaryAnnotator *this,uint64_t vector_offset,Object *table,Field *field,
          uint64_t parent_table_offset,
          map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
          *vtable_fields)

{
  pointer pcVar1;
  _Base_ptr p_Var2;
  Object *pOVar3;
  char cVar4;
  bool bVar5;
  BinaryRegionType BVar6;
  Field *pFVar7;
  uint64_t uVar8;
  undefined8 *puVar9;
  Schema *pSVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  long *plVar12;
  ushort uVar13;
  ushort uVar14;
  uint uVar15;
  size_type *psVar16;
  _Base_ptr p_Var17;
  char *pcVar18;
  int *piVar19;
  uint64_t uVar20;
  long lVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  unsigned_long t;
  _Rb_tree_header *p_Var23;
  char cVar24;
  uint32_t uVar25;
  ulong uVar26;
  undefined8 uVar27;
  Field FVar28;
  uint8_t uVar29;
  BaseType base_type;
  _Alloc_hider _Var30;
  ulong uVar31;
  int iVar32;
  unsigned_short vtsize;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar33;
  BinaryRegionComment vector_object_comment;
  string enum_type;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  BinaryRegionComment vector_length_comment;
  allocator<char> local_cb1;
  undefined1 local_cb0 [8];
  _Alloc_hider local_ca8;
  undefined1 local_ca0 [24];
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_c88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c70;
  _Alloc_hider local_c60;
  size_type local_c58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c50;
  ulong local_c40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c30;
  ulong local_c28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c20;
  string local_c18;
  undefined1 local_bf8 [40];
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_bd0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bb8;
  _Alloc_hider local_ba0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b90;
  _Alloc_hider local_b80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b70;
  undefined1 local_b58 [40];
  _Base_ptr local_b30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b28;
  uint64_t local_b08;
  BinarySectionType local_afc;
  Object *local_af8;
  BinaryRegionStatus local_af0;
  char *local_ae8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ae0;
  BinaryRegionCommentType local_ac8;
  undefined1 *local_ac0;
  long local_ab8;
  undefined1 local_ab0;
  undefined7 uStack_aaf;
  undefined1 *local_aa0;
  long local_a98;
  undefined1 local_a90;
  undefined7 uStack_a8f;
  size_t local_a80;
  long *local_a78;
  uint local_a70;
  long local_a68 [2];
  long *local_a58 [2];
  long local_a48 [2];
  string local_a38;
  long *local_a18 [2];
  long local_a08 [2];
  long *local_9f8 [2];
  long local_9e8 [2];
  long *local_9d8 [2];
  long local_9c8 [2];
  long *local_9b8 [2];
  long local_9a8 [2];
  long *local_998 [2];
  long local_988 [2];
  long *local_978 [2];
  long local_968 [2];
  undefined1 local_958 [8];
  _Alloc_hider local_950;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_940;
  BinaryRegionCommentType local_930;
  _Alloc_hider local_928;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_918;
  _Alloc_hider local_908;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8f8;
  ulong local_8e8;
  undefined1 local_8e0 [8];
  _Alloc_hider local_8d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8c8;
  BinaryRegionCommentType local_8b8;
  _Alloc_hider local_8b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8a0;
  _Alloc_hider local_890;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_880;
  ulong local_870;
  undefined1 local_868 [8];
  _Alloc_hider local_860;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_850;
  BinaryRegionCommentType local_840;
  _Alloc_hider local_838;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_828;
  _Alloc_hider local_818;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_808;
  ulong local_7f8;
  undefined1 local_7f0 [8];
  _Alloc_hider local_7e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7d8;
  BinaryRegionCommentType local_7c8;
  _Alloc_hider local_7c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7b0;
  _Alloc_hider local_7a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_790;
  ulong local_780;
  undefined1 local_778 [8];
  _Alloc_hider local_770;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_760;
  BinaryRegionCommentType local_750;
  _Alloc_hider local_748;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_738;
  _Alloc_hider local_728;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_718;
  ulong local_708;
  undefined1 local_700 [8];
  _Alloc_hider local_6f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6e8;
  BinaryRegionCommentType local_6d8;
  _Alloc_hider local_6d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c0;
  _Alloc_hider local_6b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6a0;
  ulong local_690;
  undefined1 local_688 [8];
  _Alloc_hider local_680;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_670;
  BinaryRegionCommentType local_660;
  _Alloc_hider local_658;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_648;
  _Alloc_hider local_638;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_628;
  ulong local_618;
  undefined1 local_610 [8];
  _Alloc_hider local_608;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f8;
  BinaryRegionCommentType local_5e8;
  _Alloc_hider local_5e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d0;
  _Alloc_hider local_5c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b0;
  ulong local_5a0;
  undefined1 local_598 [8];
  _Alloc_hider local_590;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_580;
  BinaryRegionCommentType local_570;
  _Alloc_hider local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558;
  _Alloc_hider local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  ulong local_528;
  undefined1 local_520 [8];
  _Alloc_hider local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  BinaryRegionCommentType local_4f8;
  _Alloc_hider local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e0;
  _Alloc_hider local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  ulong local_4b0;
  undefined1 local_4a8 [8];
  _Alloc_hider local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  BinaryRegionCommentType local_480;
  _Alloc_hider local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  _Alloc_hider local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  ulong local_438;
  undefined1 local_430 [8];
  _Alloc_hider local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  BinaryRegionCommentType local_408;
  _Alloc_hider local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  _Alloc_hider local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  ulong local_3c0;
  undefined1 local_3b8 [8];
  _Alloc_hider local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  BinaryRegionCommentType local_390;
  _Alloc_hider local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  _Alloc_hider local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  ulong local_348;
  long *local_340 [2];
  long local_330 [2];
  long *local_320 [2];
  long local_310 [2];
  long *local_300 [2];
  long local_2f0 [2];
  long *local_2e0 [2];
  long local_2d0 [2];
  long *local_2c0 [2];
  long local_2b0 [2];
  undefined1 local_2a0 [8];
  _Alloc_hider local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  BinaryRegionCommentType local_278;
  _Alloc_hider local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  size_t local_230;
  undefined1 local_228 [8];
  _Alloc_hider local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  BinaryRegionCommentType local_200;
  _Alloc_hider local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  size_t local_1b8;
  undefined1 local_1b0 [8];
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  BinaryRegionCommentType local_188;
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  _Alloc_hider local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  size_t local_140;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_138;
  BinaryRegionComment local_120;
  BinaryRegionComment local_a8;
  
  local_af8 = table;
  bVar5 = ContainsSection(this,vector_offset);
  if (bVar5) {
    return;
  }
  local_ae8 = local_ae0._M_local_buf + 8;
  local_af0 = OK;
  uVar13 = 0;
  local_ae0._M_allocated_capacity = 0;
  local_ae0._M_local_buf[8] = '\0';
  local_ac0 = &local_ab0;
  local_ab8 = 0;
  local_ab0 = 0;
  local_aa0 = &local_a90;
  local_a98 = 0;
  local_a90 = 0;
  local_a80 = 0;
  local_ac8 = VectorLength;
  if (6 < *(ushort *)(field + -(long)*(int *)field)) {
    uVar13 = *(ushort *)(field + (6 - (long)*(int *)field));
  }
  if (uVar13 == 0) {
    pFVar7 = (Field *)0x0;
  }
  else {
    pFVar7 = field + (ulong)*(uint *)(field + uVar13) + (ulong)uVar13;
  }
  if (*(ushort *)(pFVar7 + -(long)*(int *)pFVar7) < 5) {
    uVar13 = 0;
  }
  else {
    uVar13 = *(ushort *)(pFVar7 + (4 - (long)*(int *)pFVar7));
  }
  if ((uVar13 == 0) || (pFVar7[uVar13].super_Table != (Table)0x12)) {
    uVar26 = this->binary_length_;
    bVar5 = vector_offset + 3 < uVar26 && 4 < uVar26;
    uVar20 = 4;
    BVar6 = Uint32;
    local_afc = Vector;
    if (vector_offset + 3 < uVar26 && 4 < uVar26) {
      local_c28 = (ulong)*(uint *)(this->binary_ + vector_offset);
    }
  }
  else {
    uVar26 = this->binary_length_;
    bVar5 = vector_offset + 7 < uVar26 && 8 < uVar26;
    uVar20 = 8;
    BVar6 = Uint64;
    local_afc = Vector64;
    if (vector_offset + 7 < uVar26 && 8 < uVar26) {
      local_c28 = *(ulong *)(this->binary_ + vector_offset);
    }
  }
  local_b08 = vector_offset;
  if (bVar5) {
    local_c30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)parent_table_offset;
    uVar8 = GetElementSize(this,field);
    local_c38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_b08 + uVar20);
    if (local_c38->_M_local_buf + uVar8 * local_c28 + -1 < (char *)this->binary_length_) {
      local_b58._0_8_ = (pointer)0x0;
      local_b58._8_8_ = (pointer)0x0;
      local_b58._16_8_ = (pointer)0x0;
      local_228._0_4_ = local_af0;
      local_220._M_p = (pointer)&local_210;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_220,local_ae8,local_ae8 + local_ae0._M_allocated_capacity);
      local_200 = local_ac8;
      local_1f8._M_p = (pointer)&local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,local_ac0,local_ac0 + local_ab8);
      local_1d8._M_p = (pointer)&local_1c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,local_aa0,local_aa0 + local_a98);
      local_1b8 = local_a80;
      anon_unknown_49::MakeBinaryRegion
                ((BinaryRegion *)local_bf8,local_b08,uVar20,BVar6,0,0,
                 (BinaryRegionComment *)local_228);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
      emplace_back<flatbuffers::BinaryRegion>
                ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                 local_b58,(BinaryRegion *)local_bf8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b80._M_p != &local_b70) {
        operator_delete(local_b80._M_p,local_b70._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ba0._M_p != &local_b90) {
        operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bd0.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish != &local_bb8) {
        operator_delete(local_bd0.
                        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        local_bb8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_p != &local_1c8) {
        operator_delete(local_1d8._M_p,local_1c8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_p != &local_1e8) {
        operator_delete(local_1f8._M_p,local_1e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_p != &local_210) {
        operator_delete(local_220._M_p,local_210._M_allocated_capacity + 1);
      }
      paVar11 = local_c38;
      lVar21 = -(long)*(int *)field;
      uVar13 = *(ushort *)(field + -(long)*(int *)field);
      if (uVar13 < 7) {
        uVar14 = 0;
      }
      else {
        uVar14 = *(ushort *)(field + lVar21 + 6);
      }
      if (uVar14 == 0) {
        pFVar7 = (Field *)0x0;
      }
      else {
        pFVar7 = field + (ulong)*(uint *)(field + uVar14) + (ulong)uVar14;
      }
      FVar28.super_Table = (Table)0x0;
      uVar26 = 0;
      if (6 < *(ushort *)(pFVar7 + -(long)*(int *)pFVar7)) {
        uVar26 = (ulong)*(ushort *)(pFVar7 + (6 - (long)*(int *)pFVar7));
      }
      if ((short)uVar26 != 0) {
        FVar28.super_Table = pFVar7[uVar26].super_Table;
      }
      if (FVar28.super_Table == (Table)0x10) {
        if (uVar13 < 9) {
          uVar13 = 0;
        }
        else {
          uVar13 = *(ushort *)(field + lVar21 + 8);
        }
        if (uVar13 == 0) {
          uVar13 = 0xffff;
        }
        else {
          uVar13 = *(short *)(field + uVar13) - 1;
        }
        p_Var23 = &(vtable_fields->_M_t)._M_impl.super__Rb_tree_header;
        p_Var2 = (vtable_fields->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var17 = &p_Var23->_M_header;
        for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar5]) {
          bVar5 = *(ushort *)&p_Var2[1]._M_color < uVar13;
          if (!bVar5) {
            p_Var17 = p_Var2;
          }
        }
        local_b30 = &p_Var23->_M_header;
        if (((_Rb_tree_header *)p_Var17 != p_Var23) &&
           (local_b30 = p_Var17, uVar13 < *(ushort *)&p_Var17[1]._M_color)) {
          local_b30 = &p_Var23->_M_header;
        }
        if ((_Rb_tree_header *)local_b30 != p_Var23) {
          uVar26 = (ulong)*(ushort *)&local_b30[1]._M_left;
          paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)this->binary_length_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_c30->_M_local_buf + uVar26 + 1) < paVar33 &&
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x2 < paVar33) {
            if (local_c28 != 0) {
              pcVar18 = local_c30->_M_local_buf +
                        *(ushort *)(this->binary_ + uVar26 + (long)local_c30);
              local_c30 = &local_b70;
              local_c20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(pcVar18 + uVar26 + 4);
              uVar26 = 0;
              do {
                paVar33 = local_c38;
                local_cb0 = (undefined1  [8])((ulong)local_cb0 & 0xffffffff00000000);
                local_ca8._M_p = local_ca0 + 8;
                local_ca0._0_8_ = 0;
                local_ca0._8_8_ = local_ca0._8_8_ & 0xffffffffffffff00;
                local_c88.
                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_c70;
                local_c88.
                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_c70._M_local_buf[0] = '\0';
                local_c60._M_p = (pointer)&local_c50;
                local_c58 = 0;
                local_c50._M_local_buf[0] = '\0';
                local_c88.
                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                ._M_impl.super__Vector_impl_data._M_start._0_4_ = VectorUnionValue;
                paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)this->binary_length_;
                local_c40 = uVar26;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_c38->_M_local_buf + 3) < paVar11 &&
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x4 < paVar11) {
                  paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)local_c38 + (ulong)*(uint *)(this->binary_ + (long)local_c38))
                  ;
                  if (paVar22 < paVar11) {
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_c20->_M_local_buf + uVar26) < paVar11 &&
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x1 < paVar11) {
                      uVar29 = (this->binary_ + (long)local_c20)[uVar26];
                      p_Var2 = local_b30[1]._M_parent;
                      if (*(ushort *)((long)p_Var2 - (long)(int)p_Var2->_M_color) < 7) {
                        uVar13 = 0;
                      }
                      else {
                        uVar13 = *(ushort *)((long)p_Var2 + (6 - (long)(int)p_Var2->_M_color));
                      }
                      if (uVar13 == 0) {
                        piVar19 = (int *)0x0;
                      }
                      else {
                        piVar19 = (int *)((long)&p_Var2->_M_color +
                                         (ulong)*(uint *)((long)&p_Var2->_M_color + (ulong)uVar13) +
                                         (ulong)uVar13);
                      }
                      if (*(ushort *)((long)piVar19 - (long)*piVar19) < 9) {
                        uVar13 = 0;
                      }
                      else {
                        uVar13 = *(ushort *)((long)piVar19 + (8 - (long)*piVar19));
                      }
                      if (uVar13 == 0) {
                        uVar25 = 0xffffffff;
                      }
                      else {
                        uVar25 = *(uint32_t *)((long)piVar19 + (ulong)uVar13);
                      }
                      bVar5 = IsValidUnionValue(this,uVar25,uVar29);
                      if (bVar5) {
                        BuildUnion_abi_cxx11_(&local_c18,this,(uint64_t)paVar22,uVar29,field);
                        std::operator+(&local_b28,"(`",&local_c18);
                        plVar12 = (long *)std::__cxx11::string::append((char *)&local_b28);
                        psVar16 = (size_type *)(plVar12 + 2);
                        if ((size_type *)*plVar12 == psVar16) {
                          local_bf8._16_8_ = *psVar16;
                          local_bf8._24_8_ = plVar12[3];
                          local_bf8._0_8_ = local_bf8 + 0x10;
                        }
                        else {
                          local_bf8._16_8_ = *psVar16;
                          local_bf8._0_8_ = (size_type *)*plVar12;
                        }
                        local_bf8._8_8_ = plVar12[1];
                        *plVar12 = (long)psVar16;
                        plVar12[1] = 0;
                        *(undefined1 *)(plVar12 + 2) = 0;
                        std::__cxx11::string::operator=((string *)&local_c60,(string *)local_bf8);
                        if ((undefined1 *)local_bf8._0_8_ != local_bf8 + 0x10) {
                          operator_delete((void *)local_bf8._0_8_,local_bf8._16_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
                          operator_delete(local_b28._M_dataplus._M_p,
                                          local_b28.field_2._M_allocated_capacity + 1);
                        }
                        BinaryRegionComment::BinaryRegionComment
                                  (&local_a8,(BinaryRegionComment *)local_cb0);
                        anon_unknown_49::MakeBinaryRegion
                                  ((BinaryRegion *)local_bf8,(uint64_t)paVar33,4,UOffset,0,
                                   (uint64_t)paVar22,&local_a8);
                        std::
                        vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                        ::emplace_back<flatbuffers::BinaryRegion>
                                  ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                    *)local_b58,(BinaryRegion *)local_bf8);
                        BinaryRegion::~BinaryRegion((BinaryRegion *)local_bf8);
                        BinaryRegionComment::~BinaryRegionComment(&local_a8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_c18._M_dataplus._M_p != &local_c18.field_2) {
                          operator_delete(local_c18._M_dataplus._M_p,
                                          local_c18.field_2._M_allocated_capacity + 1);
                        }
                        paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)(paVar33->_M_local_buf + 4);
                        iVar32 = 0;
                        goto LAB_0031598d;
                      }
                      paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(paVar33->_M_local_buf + 4);
                    }
                    else {
                      local_320[0] = local_310;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"1","");
                      local_cb0._0_4_ = 0xca;
                      std::__cxx11::string::_M_assign((string *)&local_ca8);
                      if (local_320[0] != local_310) {
                        operator_delete(local_320[0],local_310[0] + 1);
                      }
                      local_868._0_4_ = local_cb0._0_4_;
                      local_860._M_p = (pointer)&local_850;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_860,local_ca8._M_p,
                                 local_ca8._M_p + local_ca0._0_8_);
                      local_840 = (BinaryRegionCommentType)
                                  local_c88.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                      local_838._M_p = (pointer)&local_828;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_838,
                                 local_c88.
                                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,
                                 (char *)((long)local_c88.
                                                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                                ._M_impl.super__Vector_impl_data._M_finish +
                                         (long)&(local_c88.
                                                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                                ->offset));
                      local_818._M_p = (pointer)&local_808;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_818,local_c60._M_p,local_c60._M_p + local_c58);
                      local_7f8 = local_c40;
                      anon_unknown_49::MakeBinaryRegion
                                ((BinaryRegion *)local_bf8,(uint64_t)paVar33,0,Unknown,0,0,
                                 (BinaryRegionComment *)local_868);
                      std::
                      vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ::emplace_back<flatbuffers::BinaryRegion>
                                ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  *)local_b58,(BinaryRegion *)local_bf8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_b80._M_p != local_c30) {
                        operator_delete(local_b80._M_p,local_b70._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_ba0._M_p != &local_b90) {
                        operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_bd0.
                             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                             ._M_impl.super__Vector_impl_data._M_finish != &local_bb8) {
                        operator_delete(local_bd0.
                                        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,
                                        local_bb8._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_818._M_p != &local_808) {
                        operator_delete(local_818._M_p,local_808._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_838._M_p != &local_828) {
                        operator_delete(local_838._M_p,local_828._M_allocated_capacity + 1);
                      }
                      uVar27 = local_850._M_allocated_capacity;
                      _Var30._M_p = local_860._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_860._M_p != &local_850) goto LAB_00315895;
                    }
                  }
                  else {
                    local_a18[0] = local_a08;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"");
                    local_cb0._0_4_ = 0xc9;
                    std::__cxx11::string::_M_assign((string *)&local_ca8);
                    if (local_a18[0] != local_a08) {
                      operator_delete(local_a18[0],local_a08[0] + 1);
                    }
                    local_7f0._0_4_ = local_cb0._0_4_;
                    local_7e8._M_p = (pointer)&local_7d8;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_7e8,local_ca8._M_p,local_ca8._M_p + local_ca0._0_8_)
                    ;
                    local_7c8 = (BinaryRegionCommentType)
                                local_c88.
                                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    local_7c0._M_p = (pointer)&local_7b0;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_7c0,
                               local_c88.
                               super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                               (char *)((long)local_c88.
                                              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                       (long)&(local_c88.
                                               super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                              offset));
                    local_7a0._M_p = (pointer)&local_790;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_7a0,local_c60._M_p,local_c60._M_p + local_c58);
                    local_780 = local_c40;
                    anon_unknown_49::MakeBinaryRegion
                              ((BinaryRegion *)local_bf8,(uint64_t)paVar33,4,UOffset,0,
                               (uint64_t)paVar22,(BinaryRegionComment *)local_7f0);
                    std::
                    vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                    emplace_back<flatbuffers::BinaryRegion>
                              ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                *)local_b58,(BinaryRegion *)local_bf8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b80._M_p != local_c30) {
                      operator_delete(local_b80._M_p,local_b70._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_ba0._M_p != &local_b90) {
                      operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_bd0.
                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           ._M_impl.super__Vector_impl_data._M_finish != &local_bb8) {
                      operator_delete(local_bd0.
                                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,
                                      local_bb8._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_7a0._M_p != &local_790) {
                      operator_delete(local_7a0._M_p,local_790._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_7c0._M_p != &local_7b0) {
                      operator_delete(local_7c0._M_p,local_7b0._M_allocated_capacity + 1);
                    }
                    uVar27 = local_7d8._M_allocated_capacity;
                    _Var30._M_p = local_7e8._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_7e8._M_p != &local_7d8) {
LAB_00315895:
                      operator_delete(_Var30._M_p,uVar27 + 1);
                    }
                  }
                  iVar32 = 0xe;
                }
                else {
                  uVar20 = 0;
                  if (local_c38 <= paVar11) {
                    uVar20 = (long)paVar11 - (long)local_c38;
                  }
                  local_9f8[0] = local_9e8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"4","");
                  local_cb0._0_4_ = 0xca;
                  std::__cxx11::string::_M_assign((string *)&local_ca8);
                  if (local_9f8[0] != local_9e8) {
                    operator_delete(local_9f8[0],local_9e8[0] + 1);
                  }
                  local_778._0_4_ = local_cb0._0_4_;
                  local_770._M_p = (pointer)&local_760;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_770,local_ca8._M_p,local_ca8._M_p + local_ca0._0_8_);
                  local_750 = (BinaryRegionCommentType)
                              local_c88.
                              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  local_748._M_p = (pointer)&local_738;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_748,
                             local_c88.
                             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             (char *)((long)local_c88.
                                            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                     (long)&(local_c88.
                                             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                            offset));
                  local_728._M_p = (pointer)&local_718;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_728,local_c60._M_p,local_c60._M_p + local_c58);
                  local_708 = local_c40;
                  anon_unknown_49::MakeBinaryRegion
                            ((BinaryRegion *)local_bf8,(uint64_t)paVar33,uVar20,Unknown,uVar20,0,
                             (BinaryRegionComment *)local_778);
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::emplace_back<flatbuffers::BinaryRegion>
                            ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                              *)local_b58,(BinaryRegion *)local_bf8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b80._M_p != local_c30) {
                    operator_delete(local_b80._M_p,local_b70._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_ba0._M_p != &local_b90) {
                    operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_bd0.
                         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                         ._M_impl.super__Vector_impl_data._M_finish != &local_bb8) {
                    operator_delete(local_bd0.
                                    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,
                                    local_bb8._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_728._M_p != &local_718) {
                    operator_delete(local_728._M_p,local_718._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_748._M_p != &local_738) {
                    operator_delete(local_748._M_p,local_738._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_770._M_p != &local_760) {
                    operator_delete(local_770._M_p,local_760._M_allocated_capacity + 1);
                  }
                  iVar32 = 0xc;
                }
LAB_0031598d:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c60._M_p != &local_c50) {
                  operator_delete(local_c60._M_p,
                                  CONCAT71(local_c50._M_allocated_capacity._1_7_,
                                           local_c50._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c88.
                       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish != &local_c70) {
                  operator_delete(local_c88.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  CONCAT71(local_c70._M_allocated_capacity._1_7_,
                                           local_c70._M_local_buf[0]) + 1);
                }
                local_c38 = paVar33;
                if (local_ca8._M_p != local_ca0 + 8) {
                  operator_delete(local_ca8._M_p,local_ca0._8_8_ + 1);
                }
              } while (((iVar32 == 0xe) || (iVar32 == 0)) &&
                      (uVar26 = uVar26 + 1, local_c28 != uVar26));
            }
          }
          else {
            uVar20 = (long)paVar33 - (long)local_c38;
            if (paVar33 < local_c38) {
              uVar20 = 0;
            }
            local_ca8._M_p = local_ca0 + 8;
            local_cb0 = (undefined1  [8])((ulong)local_cb0 & 0xffffffff00000000);
            local_ca0._0_8_ = 0;
            local_ca0._8_8_ = local_ca0._8_8_ & 0xffffffffffffff00;
            local_c88.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_c70;
            local_c88.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_c70._M_local_buf[0] = '\0';
            local_c60._M_p = (pointer)&local_c50;
            local_c58 = 0;
            local_c50._M_local_buf[0] = '\0';
            local_c40 = 0;
            local_c88.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = VectorUnionValue;
            local_300[0] = local_2f0;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"2","");
            local_cb0._0_4_ = 0xca;
            std::__cxx11::string::_M_assign((string *)&local_ca8);
            if (local_300[0] != local_2f0) {
              operator_delete(local_300[0],local_2f0[0] + 1);
            }
            BinaryRegionComment::BinaryRegionComment(&local_120,(BinaryRegionComment *)local_cb0);
            anon_unknown_49::MakeBinaryRegion
                      ((BinaryRegion *)local_bf8,(uint64_t)paVar11,uVar20,Unknown,uVar20,0,
                       &local_120);
            std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
            emplace_back<flatbuffers::BinaryRegion>
                      ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                        *)local_b58,(BinaryRegion *)local_bf8);
            BinaryRegion::~BinaryRegion((BinaryRegion *)local_bf8);
            BinaryRegionComment::~BinaryRegionComment(&local_120);
            BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_cb0);
          }
        }
      }
      else if (FVar28.super_Table == (Table)0xf) {
        pSVar10 = this->schema_;
        if (*(ushort *)(pSVar10 + -(long)*(int *)pSVar10) < 5) {
          uVar14 = 0;
        }
        else {
          uVar14 = *(ushort *)(pSVar10 + (4 - (long)*(int *)pSVar10));
        }
        if (uVar14 == 0) {
          pSVar10 = (Schema *)0x0;
        }
        else {
          pSVar10 = pSVar10 + (ulong)*(uint *)(pSVar10 + uVar14) + (ulong)uVar14;
        }
        if (uVar13 < 7) {
          uVar13 = 0;
        }
        else {
          uVar13 = *(ushort *)(field + lVar21 + 6);
        }
        if (uVar13 == 0) {
          pFVar7 = (Field *)0x0;
        }
        else {
          pFVar7 = field + (ulong)*(uint *)(field + uVar13) + (ulong)uVar13;
        }
        if (*(ushort *)(pFVar7 + -(long)*(int *)pFVar7) < 9) {
          uVar13 = 0;
        }
        else {
          uVar13 = *(ushort *)(pFVar7 + (8 - (long)*(int *)pFVar7));
        }
        if (uVar13 == 0) {
          uVar15 = 0xffffffff;
        }
        else {
          uVar15 = *(uint *)(pFVar7 + uVar13);
        }
        if (*(uint *)pSVar10 <= uVar15) {
          __assert_fail("i < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector.h"
                        ,0xc1,
                        "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
                       );
        }
        lVar21 = (ulong)*(uint *)(pSVar10 + (ulong)(uVar15 << 2) + 4) + (ulong)(uVar15 << 2);
        local_b30 = (_Base_ptr)(pSVar10 + lVar21 + 4);
        if (*(ushort *)((long)local_b30 - (long)*(int *)&local_b30->_M_color) < 9) {
          uVar13 = 0;
        }
        else {
          uVar13 = *(ushort *)(pSVar10 + ((lVar21 + 0xc) - (long)*(int *)&local_b30->_M_color));
        }
        if ((uVar13 == 0) || (((Table *)&local_b30->_M_color)[uVar13] == (Table)0x0)) {
          if (local_c28 != 0) {
            pcVar1 = local_ca0 + 8;
            local_c20 = &local_b70;
            uVar26 = 0;
            do {
              paVar33 = local_c38;
              local_cb0 = (undefined1  [8])((ulong)local_cb0 & 0xffffffff00000000);
              local_ca0._0_8_ = 0;
              local_ca0._8_8_ = local_ca0._8_8_ & 0xffffffffffffff00;
              local_c88.
              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_c70._M_local_buf[0] = '\0';
              local_c60._M_p = (pointer)&local_c50;
              local_c58 = 0;
              local_c50._M_local_buf[0] = '\0';
              local_c88.
              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = VectorTableValue;
              paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)this->binary_length_;
              local_ca8._M_p = pcVar1;
              local_c88.
              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_c70;
              local_c40 = uVar26;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_c38->_M_local_buf + 3) < paVar11 &&
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x4 < paVar11) {
                paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)local_c38 + (ulong)*(uint *)(this->binary_ + (long)local_c38));
                if (paVar22 < paVar11) {
                  if (paVar22 == local_c30) {
                    local_a58[0] = local_a48;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_a58,"");
                    local_cb0._0_4_ = 0xcf;
                    std::__cxx11::string::_M_assign((string *)&local_ca8);
                    if (local_a58[0] != local_a48) {
                      operator_delete(local_a58[0],local_a48[0] + 1);
                    }
                    local_520._0_4_ = local_cb0._0_4_;
                    local_518._M_p = (pointer)&local_508;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_518,local_ca8._M_p,local_ca8._M_p + local_ca0._0_8_)
                    ;
                    local_4f8 = (BinaryRegionCommentType)
                                local_c88.
                                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    local_4f0._M_p = (pointer)&local_4e0;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_4f0,
                               local_c88.
                               super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                               (char *)((long)local_c88.
                                              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                       (long)&(local_c88.
                                               super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                              offset));
                    local_4d0._M_p = (pointer)&local_4c0;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_4d0,local_c60._M_p,local_c60._M_p + local_c58);
                    local_4b0 = local_c40;
                    anon_unknown_49::MakeBinaryRegion
                              ((BinaryRegion *)local_bf8,(uint64_t)paVar33,4,UOffset,0,
                               (uint64_t)paVar22,(BinaryRegionComment *)local_520);
                    std::
                    vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                    emplace_back<flatbuffers::BinaryRegion>
                              ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                *)local_b58,(BinaryRegion *)local_bf8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b80._M_p != local_c20) {
                      operator_delete(local_b80._M_p,local_b70._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_ba0._M_p != &local_b90) {
                      operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_bd0.
                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           ._M_impl.super__Vector_impl_data._M_finish != &local_bb8) {
                      operator_delete(local_bd0.
                                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,
                                      local_bb8._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_4d0._M_p != &local_4c0) {
                      operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_4f0._M_p != &local_4e0) {
                      operator_delete(local_4f0._M_p,local_4e0._M_allocated_capacity + 1);
                    }
                    uVar27 = local_508._M_allocated_capacity;
                    _Var30._M_p = local_518._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_518._M_p != &local_508) goto LAB_00314d5e;
                  }
                  else {
                    local_598._0_4_ = OK;
                    local_590._M_p = (pointer)&local_580;
                    std::__cxx11::string::_M_construct<char*>((string *)&local_590,pcVar1,pcVar1);
                    local_570 = (BinaryRegionCommentType)
                                local_c88.
                                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    local_568._M_p = (pointer)&local_558;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_568,
                               local_c88.
                               super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                               (char *)((long)local_c88.
                                              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                       (long)&(local_c88.
                                               super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                              offset));
                    local_548._M_p = (pointer)&local_538;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_548,local_c60._M_p,local_c60._M_p + local_c58);
                    local_528 = local_c40;
                    anon_unknown_49::MakeBinaryRegion
                              ((BinaryRegion *)local_bf8,(uint64_t)paVar33,4,UOffset,0,
                               (uint64_t)paVar22,(BinaryRegionComment *)local_598);
                    std::
                    vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                    emplace_back<flatbuffers::BinaryRegion>
                              ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                *)local_b58,(BinaryRegion *)local_bf8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b80._M_p != local_c20) {
                      operator_delete(local_b80._M_p,local_b70._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_ba0._M_p != &local_b90) {
                      operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_bd0.
                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           ._M_impl.super__Vector_impl_data._M_finish != &local_bb8) {
                      operator_delete(local_bd0.
                                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,
                                      local_bb8._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_548._M_p != &local_538) {
                      operator_delete(local_548._M_p,local_538._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_568._M_p != &local_558) {
                      operator_delete(local_568._M_p,local_558._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_590._M_p != &local_580) {
                      operator_delete(local_590._M_p,local_580._M_allocated_capacity + 1);
                    }
                    BuildTable(this,(uint64_t)paVar22,Table,(Object *)local_b30);
                  }
                }
                else {
                  local_9b8[0] = local_9a8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_9b8,"");
                  local_cb0._0_4_ = 0xc9;
                  std::__cxx11::string::_M_assign((string *)&local_ca8);
                  if (local_9b8[0] != local_9a8) {
                    operator_delete(local_9b8[0],local_9a8[0] + 1);
                  }
                  local_4a8._0_4_ = local_cb0._0_4_;
                  local_4a0._M_p = (pointer)&local_490;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_4a0,local_ca8._M_p,local_ca8._M_p + local_ca0._0_8_);
                  local_480 = (BinaryRegionCommentType)
                              local_c88.
                              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  local_478._M_p = (pointer)&local_468;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_478,
                             local_c88.
                             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             (char *)((long)local_c88.
                                            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                     (long)&(local_c88.
                                             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                            offset));
                  local_458._M_p = (pointer)&local_448;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_458,local_c60._M_p,local_c60._M_p + local_c58);
                  local_438 = local_c40;
                  anon_unknown_49::MakeBinaryRegion
                            ((BinaryRegion *)local_bf8,(uint64_t)paVar33,4,UOffset,0,
                             (uint64_t)paVar22,(BinaryRegionComment *)local_4a8);
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::emplace_back<flatbuffers::BinaryRegion>
                            ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                              *)local_b58,(BinaryRegion *)local_bf8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b80._M_p != local_c20) {
                    operator_delete(local_b80._M_p,local_b70._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_ba0._M_p != &local_b90) {
                    operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_bd0.
                         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                         ._M_impl.super__Vector_impl_data._M_finish != &local_bb8) {
                    operator_delete(local_bd0.
                                    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,
                                    local_bb8._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_458._M_p != &local_448) {
                    operator_delete(local_458._M_p,local_448._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_478._M_p != &local_468) {
                    operator_delete(local_478._M_p,local_468._M_allocated_capacity + 1);
                  }
                  uVar27 = local_490._M_allocated_capacity;
                  _Var30._M_p = local_4a0._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4a0._M_p != &local_490) {
LAB_00314d5e:
                    operator_delete(_Var30._M_p,uVar27 + 1);
                  }
                }
                lVar21 = 0;
                paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar33->_M_local_buf + 4);
              }
              else {
                uVar20 = 0;
                if (local_c38 <= paVar11) {
                  uVar20 = (long)paVar11 - (long)local_c38;
                }
                local_998[0] = local_988;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_998,"4","");
                local_cb0._0_4_ = 0xca;
                std::__cxx11::string::_M_assign((string *)&local_ca8);
                if (local_998[0] != local_988) {
                  operator_delete(local_998[0],local_988[0] + 1);
                }
                local_430._0_4_ = local_cb0._0_4_;
                local_428._M_p = (pointer)&local_418;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_428,local_ca8._M_p,local_ca8._M_p + local_ca0._0_8_);
                local_408 = (BinaryRegionCommentType)
                            local_c88.
                            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                local_400._M_p = (pointer)&local_3f0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_400,
                           local_c88.
                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (char *)((long)local_c88.
                                          super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                   (long)&(local_c88.
                                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                          offset));
                local_3e0._M_p = (pointer)&local_3d0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_3e0,local_c60._M_p,local_c60._M_p + local_c58);
                local_3c0 = local_c40;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_bf8,(uint64_t)paVar33,uVar20,Unknown,uVar20,0,
                           (BinaryRegionComment *)local_430);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>
                          ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            *)local_b58,(BinaryRegion *)local_bf8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b80._M_p != local_c20) {
                  operator_delete(local_b80._M_p,local_b70._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_ba0._M_p != &local_b90) {
                  operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_bd0.
                       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish != &local_bb8) {
                  operator_delete(local_bd0.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  local_bb8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e0._M_p != &local_3d0) {
                  operator_delete(local_3e0._M_p,local_3d0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_400._M_p != &local_3f0) {
                  operator_delete(local_400._M_p,local_3f0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_428._M_p != &local_418) {
                  operator_delete(local_428._M_p,local_418._M_allocated_capacity + 1);
                }
                lVar21 = 6;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c60._M_p != &local_c50) {
                operator_delete(local_c60._M_p,
                                CONCAT71(local_c50._M_allocated_capacity._1_7_,
                                         local_c50._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c88.
                     super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                     ._M_impl.super__Vector_impl_data._M_finish != &local_c70) {
                operator_delete(local_c88.
                                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                                CONCAT71(local_c70._M_allocated_capacity._1_7_,
                                         local_c70._M_local_buf[0]) + 1);
              }
              local_c38 = paVar33;
              if (local_ca8._M_p != pcVar1) {
                operator_delete(local_ca8._M_p,local_ca0._8_8_ + 1);
              }
            } while ((lVar21 == 0) && (uVar26 = uVar26 + 1, local_c28 != uVar26));
          }
        }
        else if (local_c28 != 0) {
          local_c28 = local_c28 - 1;
          t = 0;
          do {
            NumToString<unsigned_long>((string *)local_cb0,t);
            plVar12 = (long *)std::__cxx11::string::replace((ulong)local_cb0,0,(char *)0x0,0x382694)
            ;
            p_Var2 = local_b30;
            psVar16 = (size_type *)(plVar12 + 2);
            if ((size_type *)*plVar12 == psVar16) {
              local_bf8._16_8_ = *psVar16;
              local_bf8._24_8_ = plVar12[3];
              local_bf8._0_8_ = local_bf8 + 0x10;
            }
            else {
              local_bf8._16_8_ = *psVar16;
              local_bf8._0_8_ = (size_type *)*plVar12;
            }
            local_bf8._8_8_ = plVar12[1];
            *plVar12 = (long)psVar16;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::append(local_bf8);
            psVar16 = (size_type *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_a38.field_2._M_allocated_capacity = *psVar16;
              local_a38.field_2._8_8_ = plVar12[3];
              local_a38._M_dataplus._M_p = (pointer)&local_a38.field_2;
            }
            else {
              local_a38.field_2._M_allocated_capacity = *psVar16;
              local_a38._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_a38._M_string_length = plVar12[1];
            *plVar12 = (long)psVar16;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)BuildStruct(this,(uint64_t)local_c38,
                                     (vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                      *)local_b58,&local_a38,(Object *)p_Var2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
              operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1
                             );
            }
            if ((undefined1 *)local_bf8._0_8_ != local_bf8 + 0x10) {
              operator_delete((void *)local_bf8._0_8_,local_bf8._16_8_ + 1);
            }
            if (local_cb0 != (undefined1  [8])local_ca0) {
              operator_delete((void *)local_cb0,local_ca0._0_8_ + 1);
            }
          } while ((paVar11 != local_c38) &&
                  (bVar5 = local_c28 != t, t = t + 1, local_c38 = paVar11, bVar5));
        }
      }
      else if (FVar28.super_Table == (Table)0xd) {
        if (local_c28 != 0) {
          local_c30 = &local_b70;
          uVar26 = 0;
          do {
            paVar33 = local_c38;
            local_ca8._M_p = local_ca0 + 8;
            local_cb0 = (undefined1  [8])((ulong)local_cb0 & 0xffffffff00000000);
            local_ca0._0_8_ = 0;
            local_ca0._8_8_ = local_ca0._8_8_ & 0xffffffffffffff00;
            local_c88.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_c70._M_local_buf[0] = '\0';
            local_c60._M_p = (pointer)&local_c50;
            local_c58 = 0;
            local_c50._M_local_buf[0] = '\0';
            local_c88.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = VectorStringValue;
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)this->binary_length_;
            local_c88.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_c70;
            local_c40 = uVar26;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_c38->_M_local_buf + 3) < paVar11 &&
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x4 < paVar11) {
              paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)local_c38 + (ulong)*(uint *)(this->binary_ + (long)local_c38));
              if (paVar22 < paVar11) {
                local_700._0_4_ = OK;
                local_6f8._M_p = (pointer)&local_6e8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_6f8,local_ca8._M_p,local_ca8._M_p);
                local_6d8 = (BinaryRegionCommentType)
                            local_c88.
                            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                local_6d0._M_p = (pointer)&local_6c0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_6d0,
                           local_c88.
                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (char *)((long)local_c88.
                                          super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                   (long)&(local_c88.
                                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                          offset));
                local_6b0._M_p = (pointer)&local_6a0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_6b0,local_c60._M_p,local_c60._M_p + local_c58);
                local_690 = local_c40;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_bf8,(uint64_t)paVar33,4,UOffset,0,(uint64_t)paVar22
                           ,(BinaryRegionComment *)local_700);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>
                          ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            *)local_b58,(BinaryRegion *)local_bf8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b80._M_p != local_c30) {
                  operator_delete(local_b80._M_p,local_b70._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_ba0._M_p != &local_b90) {
                  operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_bd0.
                       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish != &local_bb8) {
                  operator_delete(local_bd0.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  local_bb8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6b0._M_p != &local_6a0) {
                  operator_delete(local_6b0._M_p,local_6a0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6d0._M_p != &local_6c0) {
                  operator_delete(local_6d0._M_p,local_6c0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6f8._M_p != &local_6e8) {
                  operator_delete(local_6f8._M_p,local_6e8._M_allocated_capacity + 1);
                }
                iVar32 = 0;
                BuildString(this,(uint64_t)paVar22,local_af8,field);
              }
              else {
                local_978[0] = local_968;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_978,"");
                local_cb0._0_4_ = 0xc9;
                std::__cxx11::string::_M_assign((string *)&local_ca8);
                if (local_978[0] != local_968) {
                  operator_delete(local_978[0],local_968[0] + 1);
                }
                local_688._0_4_ = local_cb0._0_4_;
                local_680._M_p = (pointer)&local_670;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_680,local_ca8._M_p,local_ca8._M_p + local_ca0._0_8_);
                local_660 = (BinaryRegionCommentType)
                            local_c88.
                            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                local_658._M_p = (pointer)&local_648;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_658,
                           local_c88.
                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (char *)((long)local_c88.
                                          super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                   (long)&(local_c88.
                                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                          offset));
                local_638._M_p = (pointer)&local_628;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_638,local_c60._M_p,local_c60._M_p + local_c58);
                local_618 = local_c40;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_bf8,(uint64_t)paVar33,4,UOffset,0,(uint64_t)paVar22
                           ,(BinaryRegionComment *)local_688);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>
                          ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            *)local_b58,(BinaryRegion *)local_bf8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b80._M_p != local_c30) {
                  operator_delete(local_b80._M_p,local_b70._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_ba0._M_p != &local_b90) {
                  operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_bd0.
                       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish != &local_bb8) {
                  operator_delete(local_bd0.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  local_bb8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_638._M_p != &local_628) {
                  operator_delete(local_638._M_p,local_628._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_658._M_p != &local_648) {
                  operator_delete(local_658._M_p,local_648._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_680._M_p != &local_670) {
                  operator_delete(local_680._M_p,local_670._M_allocated_capacity + 1);
                }
                iVar32 = 0xb;
              }
              local_c38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_c38->_M_local_buf + 4);
            }
            else {
              uVar20 = 0;
              if (local_c38 <= paVar11) {
                uVar20 = (long)paVar11 - (long)local_c38;
              }
              local_9d8[0] = local_9c8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"4","");
              local_cb0._0_4_ = 0xca;
              std::__cxx11::string::_M_assign((string *)&local_ca8);
              if (local_9d8[0] != local_9c8) {
                operator_delete(local_9d8[0],local_9c8[0] + 1);
              }
              local_610._0_4_ = local_cb0._0_4_;
              local_608._M_p = (pointer)&local_5f8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_608,local_ca8._M_p,local_ca8._M_p + local_ca0._0_8_);
              local_5e8 = (BinaryRegionCommentType)
                          local_c88.
                          super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              local_5e0._M_p = (pointer)&local_5d0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_5e0,
                         local_c88.
                         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (char *)((long)local_c88.
                                        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                 (long)&(local_c88.
                                         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->offset
                                 ));
              local_5c0._M_p = (pointer)&local_5b0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_5c0,local_c60._M_p,local_c60._M_p + local_c58);
              local_5a0 = local_c40;
              anon_unknown_49::MakeBinaryRegion
                        ((BinaryRegion *)local_bf8,(uint64_t)paVar33,uVar20,Unknown,uVar20,0,
                         (BinaryRegionComment *)local_610);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              emplace_back<flatbuffers::BinaryRegion>
                        ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                          *)local_b58,(BinaryRegion *)local_bf8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b80._M_p != local_c30) {
                operator_delete(local_b80._M_p,local_b70._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_ba0._M_p != &local_b90) {
                operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_bd0.
                     super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                     ._M_impl.super__Vector_impl_data._M_finish != &local_bb8) {
                operator_delete(local_bd0.
                                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                                local_bb8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5c0._M_p != &local_5b0) {
                operator_delete(local_5c0._M_p,local_5b0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5e0._M_p != &local_5d0) {
                operator_delete(local_5e0._M_p,local_5d0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_608._M_p != &local_5f8) {
                operator_delete(local_608._M_p,local_5f8._M_allocated_capacity + 1);
              }
              iVar32 = 9;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c60._M_p != &local_c50) {
              operator_delete(local_c60._M_p,
                              CONCAT71(local_c50._M_allocated_capacity._1_7_,
                                       local_c50._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c88.
                   super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                   ._M_impl.super__Vector_impl_data._M_finish != &local_c70) {
              operator_delete(local_c88.
                              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                              CONCAT71(local_c70._M_allocated_capacity._1_7_,
                                       local_c70._M_local_buf[0]) + 1);
            }
            if (local_ca8._M_p != local_ca0 + 8) {
              operator_delete(local_ca8._M_p,local_ca0._8_8_ + 1);
            }
          } while (((iVar32 == 0xb) || (iVar32 == 0)) && (uVar26 = uVar26 + 1, local_c28 != uVar26))
          ;
        }
      }
      else {
        if (uVar13 < 7) {
          uVar14 = 0;
        }
        else {
          uVar14 = *(ushort *)(field + lVar21 + 6);
        }
        if (uVar14 == 0) {
          pFVar7 = (Field *)0x0;
        }
        else {
          pFVar7 = field + (ulong)*(uint *)(field + uVar14) + (ulong)uVar14;
        }
        if (*(ushort *)(pFVar7 + -(long)*(int *)pFVar7) < 7) {
          uVar14 = 0;
        }
        else {
          uVar14 = *(ushort *)(pFVar7 + (6 - (long)*(int *)pFVar7));
        }
        if ((uVar14 != 0) && ((int)(char)pFVar7[uVar14].super_Table - 1U < 0xc)) {
          if (uVar13 < 7) {
            uVar14 = 0;
          }
          else {
            uVar14 = *(ushort *)(field + lVar21 + 6);
          }
          if (uVar14 == 0) {
            pFVar7 = (Field *)0x0;
          }
          else {
            pFVar7 = field + (ulong)*(uint *)(field + uVar14) + (ulong)uVar14;
          }
          base_type = None;
          uVar14 = 0;
          if (6 < *(ushort *)(pFVar7 + -(long)*(int *)pFVar7)) {
            uVar14 = *(ushort *)(pFVar7 + (6 - (long)*(int *)pFVar7));
          }
          if (uVar14 != 0) {
            base_type = (BaseType)(char)pFVar7[uVar14].super_Table;
          }
          BVar6 = GetRegionType(base_type);
          local_c20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_c20._4_4_,BVar6);
          if (uVar13 < 7) {
            uVar13 = 0;
          }
          else {
            uVar13 = *(ushort *)(field + lVar21 + 6);
          }
          if (uVar13 == 0) {
            pFVar7 = (Field *)0x0;
          }
          else {
            pFVar7 = field + (ulong)*(uint *)(field + uVar13) + (ulong)uVar13;
          }
          if (*(ushort *)(pFVar7 + -(long)*(int *)pFVar7) < 7) {
            uVar13 = 0;
          }
          else {
            uVar13 = *(ushort *)(pFVar7 + (6 - (long)*(int *)pFVar7));
          }
          if (uVar13 == 0) {
            uVar26 = 0;
          }
          else {
            uVar26 = (ulong)(uint)(int)(char)pFVar7[uVar13].super_Table;
          }
          if (local_c28 != 0) {
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&GetTypeSize(reflection::BaseType)::sizes)[uVar26];
            local_b30 = (_Base_ptr)(paVar11->_M_local_buf + -1);
            local_c30 = &local_b70;
            uVar26 = 0;
            do {
              paVar22 = local_c38;
              local_ca8._M_p = local_ca0 + 8;
              local_cb0 = (undefined1  [8])((ulong)local_cb0 & 0xffffffff00000000);
              local_ca0._0_8_ = 0;
              local_ca0._8_8_ = local_ca0._8_8_ & 0xffffffffffffff00;
              local_c88.
              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_c70;
              local_c88.
              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_c70._M_local_buf[0] = '\0';
              local_c60._M_p = (pointer)&local_c50;
              local_c58 = 0;
              local_c50._M_local_buf[0] = '\0';
              local_c88.
              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = VectorValue;
              paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)this->binary_length_;
              local_c40 = uVar26;
              if ((paVar11 < paVar33) &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_c38->_M_local_buf + (long)&local_b30->_M_color) < paVar33)) {
                lVar21 = -(long)*(int *)field;
                if (*(ushort *)(field + -(long)*(int *)field) < 7) {
                  uVar13 = 0;
                }
                else {
                  uVar13 = *(ushort *)(field + lVar21 + 6);
                }
                if (uVar13 == 0) {
                  pFVar7 = (Field *)0x0;
                }
                else {
                  pFVar7 = field + (ulong)*(uint *)(field + uVar13) + (ulong)uVar13;
                }
                FVar28.super_Table = (Table)0x0;
                uVar31 = 0;
                if (6 < *(ushort *)(pFVar7 + -(long)*(int *)pFVar7)) {
                  uVar31 = (ulong)*(ushort *)(pFVar7 + (6 - (long)*(int *)pFVar7));
                }
                if ((short)uVar31 != 0) {
                  FVar28.super_Table = pFVar7[uVar31].super_Table;
                }
                if ((FVar28.super_Table == (Table)0x10) || (FVar28.super_Table == (Table)0x1)) {
                  if (paVar33 <= local_c38 ||
                      paVar33 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x2) {
                    uVar29 = '\0';
                  }
                  else {
                    uVar29 = this->binary_[(long)local_c38];
                  }
                  if (*(ushort *)(field + -(long)*(int *)field) < 7) {
                    uVar13 = 0;
                  }
                  else {
                    uVar13 = *(ushort *)(field + lVar21 + 6);
                  }
                  if (uVar13 == 0) {
                    pFVar7 = (Field *)0x0;
                  }
                  else {
                    pFVar7 = field + (ulong)*(uint *)(field + uVar13) + (ulong)uVar13;
                  }
                  if (*(ushort *)(pFVar7 + -(long)*(int *)pFVar7) < 9) {
                    uVar13 = 0;
                  }
                  else {
                    uVar13 = *(ushort *)(pFVar7 + (8 - (long)*(int *)pFVar7));
                  }
                  if (uVar13 == 0) {
                    uVar25 = 0xffffffff;
                  }
                  else {
                    uVar25 = *(uint32_t *)(pFVar7 + uVar13);
                  }
                  if (paVar33 <= local_c38 ||
                      paVar33 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x2) {
                    std::__throw_bad_optional_access();
                  }
                  bVar5 = IsValidUnionValue(this,uVar25,uVar29);
                  iVar32 = 0;
                  if (!bVar5) {
                    local_340[0] = local_330;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"");
                    local_cb0._0_4_ = 0xce;
                    std::__cxx11::string::_M_assign((string *)&local_ca8);
                    paVar33 = local_c38;
                    if (local_340[0] != local_330) {
                      operator_delete(local_340[0],local_330[0] + 1);
                    }
                    local_958._0_4_ = local_cb0._0_4_;
                    local_950._M_p = (pointer)&local_940;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_950,local_ca8._M_p,local_ca8._M_p + local_ca0._0_8_)
                    ;
                    local_930 = (BinaryRegionCommentType)
                                local_c88.
                                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    local_928._M_p = (pointer)&local_918;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_928,
                               local_c88.
                               super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                               (char *)((long)local_c88.
                                              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                       (long)&(local_c88.
                                               super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                              offset));
                    local_908._M_p = (pointer)&local_8f8;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_908,local_c60._M_p,local_c60._M_p + local_c58);
                    local_8e8 = local_c40;
                    anon_unknown_49::MakeBinaryRegion
                              ((BinaryRegion *)local_bf8,(uint64_t)paVar33,(uint64_t)paVar11,
                               (BinaryRegionType)local_c20,0,0,(BinaryRegionComment *)local_958);
                    std::
                    vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                    emplace_back<flatbuffers::BinaryRegion>
                              ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                *)local_b58,(BinaryRegion *)local_bf8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b80._M_p != local_c30) {
                      operator_delete(local_b80._M_p,local_b70._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_ba0._M_p != &local_b90) {
                      operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_bd0.
                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           ._M_impl.super__Vector_impl_data._M_finish != &local_bb8) {
                      operator_delete(local_bd0.
                                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,
                                      local_bb8._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_908._M_p != &local_8f8) {
                      operator_delete(local_908._M_p,local_8f8._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_928._M_p != &local_918) {
                      operator_delete(local_928._M_p,local_918._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_950._M_p != &local_940) {
                      operator_delete(local_950._M_p,local_940._M_allocated_capacity + 1);
                    }
                    local_c38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(paVar33->_M_local_buf + (long)paVar11);
                    iVar32 = 0x11;
                  }
                  if (!bVar5) goto LAB_00316590;
                }
                local_3b8._0_4_ = local_cb0._0_4_;
                local_3b0._M_p = (pointer)&local_3a0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_3b0,local_ca8._M_p,local_ca8._M_p + local_ca0._0_8_);
                local_390 = (BinaryRegionCommentType)
                            local_c88.
                            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                local_388._M_p = (pointer)&local_378;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_388,
                           local_c88.
                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (char *)((long)local_c88.
                                          super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                   (long)&(local_c88.
                                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                          offset));
                paVar33 = local_c38;
                local_368._M_p = (pointer)&local_358;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_368,local_c60._M_p,local_c60._M_p + local_c58);
                local_348 = local_c40;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_bf8,(uint64_t)paVar33,(uint64_t)paVar11,
                           (BinaryRegionType)local_c20,0,0,(BinaryRegionComment *)local_3b8);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>
                          ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            *)local_b58,(BinaryRegion *)local_bf8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b80._M_p != local_c30) {
                  operator_delete(local_b80._M_p,local_b70._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_ba0._M_p != &local_b90) {
                  operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_bd0.
                       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish != &local_bb8) {
                  operator_delete(local_bd0.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  local_bb8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_368._M_p != &local_358) {
                  operator_delete(local_368._M_p,local_358._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_388._M_p != &local_378) {
                  operator_delete(local_388._M_p,local_378._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b0._M_p != &local_3a0) {
                  operator_delete(local_3b0._M_p,local_3a0._M_allocated_capacity + 1);
                }
                local_c38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(paVar33->_M_local_buf + (long)paVar11);
                iVar32 = 0;
              }
              else {
                uVar20 = 0;
                if (local_c38 <= paVar33) {
                  uVar20 = (long)paVar33 - (long)local_c38;
                }
                cVar24 = '\x01';
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x9 < paVar11) {
                  paVar33 = paVar11;
                  cVar4 = '\x04';
                  do {
                    cVar24 = cVar4;
                    if (paVar33 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x64) {
                      cVar24 = cVar24 + -2;
                      goto LAB_0031635c;
                    }
                    if (paVar33 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x3e8) {
                      cVar24 = cVar24 + -1;
                      goto LAB_0031635c;
                    }
                    if (paVar33 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x2710) goto LAB_0031635c;
                    bVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x1869f < paVar33;
                    paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)((ulong)paVar33 / 10000);
                    cVar4 = cVar24 + '\x04';
                  } while (bVar5);
                  cVar24 = cVar24 + '\x01';
                }
LAB_0031635c:
                local_a78 = local_a68;
                std::__cxx11::string::_M_construct((ulong)&local_a78,cVar24);
                std::__detail::__to_chars_10_impl<unsigned_long>
                          ((char *)local_a78,local_a70,(unsigned_long)paVar11);
                local_cb0._0_4_ = 0xca;
                std::__cxx11::string::_M_assign((string *)&local_ca8);
                if (local_a78 != local_a68) {
                  operator_delete(local_a78,local_a68[0] + 1);
                }
                local_8e0._0_4_ = local_cb0._0_4_;
                local_8d8._M_p = (pointer)&local_8c8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_8d8,local_ca8._M_p,local_ca8._M_p + local_ca0._0_8_);
                local_8b8 = (BinaryRegionCommentType)
                            local_c88.
                            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                local_8b0._M_p = (pointer)&local_8a0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_8b0,
                           local_c88.
                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (char *)((long)local_c88.
                                          super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                   (long)&(local_c88.
                                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                          offset));
                local_890._M_p = (pointer)&local_880;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_890,local_c60._M_p,local_c60._M_p + local_c58);
                local_870 = local_c40;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_bf8,(uint64_t)paVar22,uVar20,Unknown,uVar20,0,
                           (BinaryRegionComment *)local_8e0);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>
                          ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            *)local_b58,(BinaryRegion *)local_bf8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b80._M_p != local_c30) {
                  operator_delete(local_b80._M_p,local_b70._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_ba0._M_p != &local_b90) {
                  operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_bd0.
                       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish != &local_bb8) {
                  operator_delete(local_bd0.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  local_bb8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_890._M_p != &local_880) {
                  operator_delete(local_890._M_p,local_880._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_8b0._M_p != &local_8a0) {
                  operator_delete(local_8b0._M_p,local_8a0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_8d8._M_p != &local_8c8) {
                  operator_delete(local_8d8._M_p,local_8c8._M_allocated_capacity + 1);
                }
                iVar32 = 0xf;
              }
LAB_00316590:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c60._M_p != &local_c50) {
                operator_delete(local_c60._M_p,
                                CONCAT71(local_c50._M_allocated_capacity._1_7_,
                                         local_c50._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c88.
                     super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                     ._M_impl.super__Vector_impl_data._M_finish != &local_c70) {
                operator_delete(local_c88.
                                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                                CONCAT71(local_c70._M_allocated_capacity._1_7_,
                                         local_c70._M_local_buf[0]) + 1);
              }
              if (local_ca8._M_p != local_ca0 + 8) {
                operator_delete(local_ca8._M_p,local_ca0._8_8_ + 1);
              }
            } while (((iVar32 == 0x11) || (iVar32 == 0)) &&
                    (uVar26 = uVar26 + 1, uVar26 != local_c28));
          }
        }
      }
      if (*(ushort *)(local_af8 + -(long)*(int *)local_af8) < 5) {
        uVar13 = 0;
      }
      else {
        uVar13 = *(ushort *)(local_af8 + (4 - (long)*(int *)local_af8));
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b28,
                 (char *)(local_af8 + (ulong)*(uint *)(local_af8 + uVar13) + (ulong)uVar13 + 4),
                 &local_cb1);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_b28);
      psVar16 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_c18.field_2._M_allocated_capacity = *psVar16;
        local_c18.field_2._8_8_ = plVar12[3];
        local_c18._M_dataplus._M_p = (pointer)&local_c18.field_2;
      }
      else {
        local_c18.field_2._M_allocated_capacity = *psVar16;
        local_c18._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_c18._M_string_length = plVar12[1];
      *plVar12 = (long)psVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_c18);
      psVar16 = (size_type *)(plVar12 + 2);
      if ((size_type *)*plVar12 == psVar16) {
        local_ca0._0_8_ = *psVar16;
        local_ca0._8_8_ = plVar12[3];
        local_cb0 = (undefined1  [8])local_ca0;
      }
      else {
        local_ca0._0_8_ = *psVar16;
        local_cb0 = (undefined1  [8])*plVar12;
      }
      local_ca8._M_p = (pointer)plVar12[1];
      *plVar12 = (long)psVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      local_138.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_b58._0_8_;
      local_138.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_b58._8_8_;
      local_138.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b58._16_8_;
      local_b58._0_8_ = (pointer)0x0;
      local_b58._8_8_ = (pointer)0x0;
      local_b58._16_8_ = (pointer)0x0;
      anon_unknown_49::MakeBinarySection
                ((BinarySection *)local_bf8,(string *)local_cb0,local_afc,&local_138);
      AddSection(this,local_b08,(BinarySection *)local_bf8);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                (&local_bd0);
      if ((undefined1 *)local_bf8._0_8_ != local_bf8 + 0x10) {
        operator_delete((void *)local_bf8._0_8_,local_bf8._16_8_ + 1);
      }
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                (&local_138);
      if (local_cb0 != (undefined1  [8])local_ca0) {
        operator_delete((void *)local_cb0,local_ca0._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c18._M_dataplus._M_p != &local_c18.field_2) {
        operator_delete(local_c18._M_dataplus._M_p,local_c18.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
        operator_delete(local_b28._M_dataplus._M_p,local_b28.field_2._M_allocated_capacity + 1);
      }
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                 local_b58);
      goto LAB_00316850;
    }
    local_2e0[0] = local_2d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"");
    local_af0 = ERROR_LENGTH_TOO_LONG;
    std::__cxx11::string::_M_assign((string *)&local_ae8);
    pOVar3 = local_af8;
    if (local_2e0[0] != local_2d0) {
      operator_delete(local_2e0[0],local_2d0[0] + 1);
    }
    if (*(ushort *)(pOVar3 + -(long)*(int *)pOVar3) < 5) {
      uVar13 = 0;
    }
    else {
      uVar13 = *(ushort *)(pOVar3 + (4 - (long)*(int *)pOVar3));
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b58,
               (char *)(pOVar3 + (ulong)*(uint *)(pOVar3 + uVar13) + (ulong)uVar13 + 4),&local_cb1);
    puVar9 = (undefined8 *)std::__cxx11::string::append(local_b58);
    local_b28._M_dataplus._M_p = (pointer)&local_b28.field_2;
    psVar16 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_b28.field_2._M_allocated_capacity = *psVar16;
      local_b28.field_2._8_8_ = puVar9[3];
    }
    else {
      local_b28.field_2._M_allocated_capacity = *psVar16;
      local_b28._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_b28._M_string_length = puVar9[1];
    *puVar9 = psVar16;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_b28);
    local_c18._M_dataplus._M_p = (pointer)&local_c18.field_2;
    psVar16 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_c18.field_2._M_allocated_capacity = *psVar16;
      local_c18.field_2._8_8_ = plVar12[3];
    }
    else {
      local_c18.field_2._M_allocated_capacity = *psVar16;
      local_c18._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_c18._M_string_length = plVar12[1];
    *plVar12 = (long)psVar16;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    local_2a0._0_4_ = local_af0;
    local_298._M_p = (pointer)&local_288;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298,local_ae8,local_ae8 + local_ae0._M_allocated_capacity);
    local_278 = local_ac8;
    local_270._M_p = (pointer)&local_260;
    std::__cxx11::string::_M_construct<char*>((string *)&local_270,local_ac0,local_ac0 + local_ab8);
    local_250._M_p = (pointer)&local_240;
    std::__cxx11::string::_M_construct<char*>((string *)&local_250,local_aa0,local_aa0 + local_a98);
    uVar8 = local_b08;
    local_230 = local_a80;
    anon_unknown_49::MakeBinaryRegion
              ((BinaryRegion *)local_bf8,local_b08,uVar20,BVar6,0,0,(BinaryRegionComment *)local_2a0
              );
    anon_unknown_49::MakeSingleRegionBinarySection
              ((BinarySection *)local_cb0,&local_c18,Vector,(BinaryRegion *)local_bf8);
    AddSection(this,uVar8,(BinarySection *)local_cb0);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              (&local_c88);
    if (local_cb0 != (undefined1  [8])local_ca0) {
      operator_delete((void *)local_cb0,local_ca0._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b80._M_p != &local_b70) {
      operator_delete(local_b80._M_p,local_b70._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ba0._M_p != &local_b90) {
      operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bd0.
           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
           ._M_impl.super__Vector_impl_data._M_finish != &local_bb8) {
      operator_delete(local_bd0.
                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ._M_impl.super__Vector_impl_data._M_finish,local_bb8._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_p != &local_240) {
      operator_delete(local_250._M_p,local_240._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_p != &local_260) {
      operator_delete(local_270._M_p,local_260._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_p != &local_288) {
      operator_delete(local_298._M_p,local_288._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c18._M_dataplus._M_p != &local_c18.field_2) {
      operator_delete(local_c18._M_dataplus._M_p,local_c18.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b28._M_dataplus._M_p != &local_b28.field_2) goto LAB_0031372d;
  }
  else {
    uVar20 = 0;
    if (vector_offset <= this->binary_length_) {
      uVar20 = this->binary_length_ - vector_offset;
    }
    local_2c0[0] = local_2b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"4","");
    local_af0 = ERROR_INCOMPLETE_BINARY;
    std::__cxx11::string::_M_assign((string *)&local_ae8);
    pOVar3 = local_af8;
    if (local_2c0[0] != local_2b0) {
      operator_delete(local_2c0[0],local_2b0[0] + 1);
    }
    if (*(ushort *)(pOVar3 + -(long)*(int *)pOVar3) < 5) {
      uVar13 = 0;
    }
    else {
      uVar13 = *(ushort *)(pOVar3 + (4 - (long)*(int *)pOVar3));
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b58,
               (char *)(pOVar3 + (ulong)*(uint *)(pOVar3 + uVar13) + (ulong)uVar13 + 4),&local_cb1);
    plVar12 = (long *)std::__cxx11::string::append(local_b58);
    local_b28._M_dataplus._M_p = (pointer)&local_b28.field_2;
    psVar16 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_b28.field_2._M_allocated_capacity = *psVar16;
      local_b28.field_2._8_8_ = plVar12[3];
    }
    else {
      local_b28.field_2._M_allocated_capacity = *psVar16;
      local_b28._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_b28._M_string_length = plVar12[1];
    *plVar12 = (long)psVar16;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_b28);
    local_c18._M_dataplus._M_p = (pointer)&local_c18.field_2;
    psVar16 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_c18.field_2._M_allocated_capacity = *psVar16;
      local_c18.field_2._8_8_ = plVar12[3];
    }
    else {
      local_c18.field_2._M_allocated_capacity = *psVar16;
      local_c18._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_c18._M_string_length = plVar12[1];
    *plVar12 = (long)psVar16;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    local_1b0._0_4_ = local_af0;
    local_1a8._M_p = (pointer)&local_198;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a8,local_ae8,local_ae8 + local_ae0._M_allocated_capacity);
    local_188 = local_ac8;
    local_180._M_p = (pointer)&local_170;
    std::__cxx11::string::_M_construct<char*>((string *)&local_180,local_ac0,local_ac0 + local_ab8);
    local_160._M_p = (pointer)&local_150;
    std::__cxx11::string::_M_construct<char*>((string *)&local_160,local_aa0,local_aa0 + local_a98);
    uVar8 = local_b08;
    local_140 = local_a80;
    anon_unknown_49::MakeBinaryRegion
              ((BinaryRegion *)local_bf8,local_b08,uVar20,Unknown,uVar20,0,
               (BinaryRegionComment *)local_1b0);
    anon_unknown_49::MakeSingleRegionBinarySection
              ((BinarySection *)local_cb0,&local_c18,Vector,(BinaryRegion *)local_bf8);
    AddSection(this,uVar8,(BinarySection *)local_cb0);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              (&local_c88);
    if (local_cb0 != (undefined1  [8])local_ca0) {
      operator_delete((void *)local_cb0,local_ca0._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b80._M_p != &local_b70) {
      operator_delete(local_b80._M_p,local_b70._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ba0._M_p != &local_b90) {
      operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bd0.
           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
           ._M_impl.super__Vector_impl_data._M_finish != &local_bb8) {
      operator_delete(local_bd0.
                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ._M_impl.super__Vector_impl_data._M_finish,local_bb8._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_p != &local_150) {
      operator_delete(local_160._M_p,local_150._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_p != &local_170) {
      operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_p != &local_198) {
      operator_delete(local_1a8._M_p,local_198._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c18._M_dataplus._M_p != &local_c18.field_2) {
      operator_delete(local_c18._M_dataplus._M_p,local_c18.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
LAB_0031372d:
      operator_delete(local_b28._M_dataplus._M_p,local_b28.field_2._M_allocated_capacity + 1);
    }
  }
  if ((pointer)local_b58._0_8_ != (pointer)(local_b58 + 0x10)) {
    operator_delete((void *)local_b58._0_8_,(ulong)((long)(uint64_t *)local_b58._16_8_ + 1));
  }
LAB_00316850:
  if (local_aa0 != &local_a90) {
    operator_delete(local_aa0,CONCAT71(uStack_a8f,local_a90) + 1);
  }
  if (local_ac0 != &local_ab0) {
    operator_delete(local_ac0,CONCAT71(uStack_aaf,local_ab0) + 1);
  }
  if (local_ae8 != local_ae0._M_local_buf + 8) {
    operator_delete(local_ae8,CONCAT71(local_ae0._9_7_,local_ae0._M_local_buf[8]) + 1);
  }
  return;
}

Assistant:

void BinaryAnnotator::BuildVector(
    const uint64_t vector_offset, const reflection::Object *const table,
    const reflection::Field *const field, const uint64_t parent_table_offset,
    const std::map<uint16_t, VTable::Entry> vtable_fields) {
  if (ContainsSection(vector_offset)) { return; }

  BinaryRegionComment vector_length_comment;
  vector_length_comment.type = BinaryRegionCommentType::VectorLength;

  const bool is_64_bit_vector =
      field->type()->base_type() == reflection::BaseType::Vector64;

  flatbuffers::Optional<uint64_t> vector_length;
  uint32_t vector_length_size_type = 0;
  BinaryRegionType region_type = BinaryRegionType::Uint32;
  BinarySectionType section_type = BinarySectionType::Vector;

  if (is_64_bit_vector) {
    auto v = ReadScalar<uint64_t>(vector_offset);
    if (v.has_value()) { vector_length = v.value(); }
    vector_length_size_type = sizeof(uint64_t);
    region_type = BinaryRegionType::Uint64;
    section_type = BinarySectionType::Vector64;
  } else {
    auto v = ReadScalar<uint32_t>(vector_offset);
    if (v.has_value()) { vector_length = v.value(); }
    vector_length_size_type = sizeof(uint32_t);
    region_type = BinaryRegionType::Uint32;
    section_type = BinarySectionType::Vector;
  }

  if (!vector_length.has_value()) {
    const uint64_t remaining = RemainingBytes(vector_offset);
    SetError(vector_length_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
             "4");

    AddSection(
        vector_offset,
        MakeSingleRegionBinarySection(
            std::string(table->name()->c_str()) + "." + field->name()->c_str(),
            BinarySectionType::Vector,
            MakeBinaryRegion(vector_offset, remaining,
                             BinaryRegionType::Unknown, remaining, 0,
                             vector_length_comment)));
    return;
  }

  // Validate there are enough bytes left in the binary to process all the
  // items.
  const uint64_t last_item_offset =
      vector_offset + vector_length_size_type +
      vector_length.value() * GetElementSize(field);

  if (!IsValidOffset(last_item_offset - 1)) {
    SetError(vector_length_comment, BinaryRegionStatus::ERROR_LENGTH_TOO_LONG);
    AddSection(
        vector_offset,
        MakeSingleRegionBinarySection(
            std::string(table->name()->c_str()) + "." + field->name()->c_str(),
            BinarySectionType::Vector,
            MakeBinaryRegion(vector_offset, vector_length_size_type,
                             region_type, 0, 0, vector_length_comment)));

    return;
  }

  std::vector<BinaryRegion> regions;

  regions.push_back(MakeBinaryRegion(vector_offset, vector_length_size_type,
                                     region_type, 0, 0, vector_length_comment));
  // Consume the vector length offset.
  uint64_t offset = vector_offset + vector_length_size_type;

  switch (field->type()->element()) {
    case reflection::BaseType::Obj: {
      const reflection::Object *object =
          schema_->objects()->Get(field->type()->index());

      if (object->is_struct()) {
        // Vector of structs
        for (size_t i = 0; i < vector_length.value(); ++i) {
          // Structs are inline to the vector.
          const uint64_t next_offset =
              BuildStruct(offset, regions, "[" + NumToString(i) + "]", object);
          if (next_offset == offset) { break; }
          offset = next_offset;
        }
      } else {
        // Vector of objects
        for (size_t i = 0; i < vector_length.value(); ++i) {
          BinaryRegionComment vector_object_comment;
          vector_object_comment.type =
              BinaryRegionCommentType::VectorTableValue;
          vector_object_comment.index = i;

          const auto table_relative_offset = ReadScalar<uint32_t>(offset);
          if (!table_relative_offset.has_value()) {
            const uint64_t remaining = RemainingBytes(offset);
            SetError(vector_object_comment,
                     BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "4");

            regions.push_back(
                MakeBinaryRegion(offset, remaining, BinaryRegionType::Unknown,
                                 remaining, 0, vector_object_comment));
            break;
          }

          // The table offset is relative from the offset location itself.
          const uint64_t table_offset = offset + table_relative_offset.value();

          if (!IsValidOffset(table_offset)) {
            SetError(vector_object_comment,
                     BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);
            regions.push_back(MakeBinaryRegion(
                offset, sizeof(uint32_t), BinaryRegionType::UOffset, 0,
                table_offset, vector_object_comment));

            offset += sizeof(uint32_t);
            continue;
          }

          if (table_offset == parent_table_offset) {
            SetError(vector_object_comment,
                     BinaryRegionStatus::ERROR_CYCLE_DETECTED);
            // A cycle detected where a table vector field is pointing to
            // itself. This should only happen in corrupted files.
            regions.push_back(MakeBinaryRegion(
                offset, sizeof(uint32_t), BinaryRegionType::UOffset, 0,
                table_offset, vector_object_comment));

            offset += sizeof(uint32_t);
            continue;
          }

          regions.push_back(MakeBinaryRegion(
              offset, sizeof(uint32_t), BinaryRegionType::UOffset, 0,
              table_offset, vector_object_comment));

          // Consume the offset to the table.
          offset += sizeof(uint32_t);

          BuildTable(table_offset, BinarySectionType::Table, object);
        }
      }
    } break;
    case reflection::BaseType::String: {
      // Vector of strings
      for (size_t i = 0; i < vector_length.value(); ++i) {
        BinaryRegionComment vector_object_comment;
        vector_object_comment.type = BinaryRegionCommentType::VectorStringValue;
        vector_object_comment.index = i;

        const auto string_relative_offset = ReadScalar<uint32_t>(offset);
        if (!string_relative_offset.has_value()) {
          const uint64_t remaining = RemainingBytes(offset);

          SetError(vector_object_comment,
                   BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "4");

          regions.push_back(
              MakeBinaryRegion(offset, remaining, BinaryRegionType::Unknown,
                               remaining, 0, vector_object_comment));
          break;
        }

        // The string offset is relative from the offset location itself.
        const uint64_t string_offset = offset + string_relative_offset.value();

        if (!IsValidOffset(string_offset)) {
          SetError(vector_object_comment,
                   BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);
          regions.push_back(MakeBinaryRegion(
              offset, sizeof(uint32_t), BinaryRegionType::UOffset, 0,
              string_offset, vector_object_comment));

          offset += sizeof(uint32_t);
          continue;
        }

        regions.push_back(MakeBinaryRegion(
            offset, sizeof(uint32_t), BinaryRegionType::UOffset, 0,
            string_offset, vector_object_comment));

        BuildString(string_offset, table, field);

        offset += sizeof(uint32_t);
      }
    } break;
    case reflection::BaseType::Union: {
      // Vector of unions
      // Unions have both their realized type (uint8_t for now) that are
      // stored separately. These are stored in the field->index() - 1
      // location.
      const uint16_t union_type_vector_id = field->id() - 1;

      auto vtable_entry = vtable_fields.find(union_type_vector_id);
      if (vtable_entry == vtable_fields.end()) {
        // TODO(dbaileychess): need to capture this error condition.
        break;
      }

      const uint64_t union_type_vector_field_offset =
          parent_table_offset + vtable_entry->second.offset_from_table;

      const auto union_type_vector_field_relative_offset =
          ReadScalar<uint16_t>(union_type_vector_field_offset);

      if (!union_type_vector_field_relative_offset.has_value()) {
        const uint64_t remaining = RemainingBytes(offset);
        BinaryRegionComment vector_union_comment;
        vector_union_comment.type = BinaryRegionCommentType::VectorUnionValue;
        SetError(vector_union_comment,
                 BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "2");

        regions.push_back(MakeBinaryRegion(offset, remaining,
                                           BinaryRegionType::Unknown, remaining,
                                           0, vector_union_comment));

        break;
      }

      // Get the offset to the first type (the + sizeof(uint32_t) is to skip
      // over the vector length which we already know). Validation happens
      // within the loop below.
      const uint64_t union_type_vector_data_offset =
          union_type_vector_field_offset +
          union_type_vector_field_relative_offset.value() + sizeof(uint32_t);

      for (size_t i = 0; i < vector_length.value(); ++i) {
        BinaryRegionComment comment;
        comment.type = BinaryRegionCommentType::VectorUnionValue;
        comment.index = i;

        const auto union_relative_offset = ReadScalar<uint32_t>(offset);
        if (!union_relative_offset.has_value()) {
          const uint64_t remaining = RemainingBytes(offset);

          SetError(comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "4");

          regions.push_back(MakeBinaryRegion(offset, remaining,
                                             BinaryRegionType::Unknown,
                                             remaining, 0, comment));

          break;
        }

        // The union offset is relative from the offset location itself.
        const uint64_t union_offset = offset + union_relative_offset.value();

        if (!IsValidOffset(union_offset)) {
          SetError(comment, BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);

          regions.push_back(MakeBinaryRegion(offset, sizeof(uint32_t),
                                             BinaryRegionType::UOffset, 0,
                                             union_offset, comment));
          continue;
        }

        const auto realized_type =
            ReadScalar<uint8_t>(union_type_vector_data_offset + i);

        if (!realized_type.has_value()) {
          SetError(comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "1");
          regions.push_back(MakeBinaryRegion(
              offset, 0, BinaryRegionType::Unknown, 0, 0, comment));
          continue;
        }

        if (!IsValidUnionValue(vtable_entry->second.field->type()->index(),
                               realized_type.value())) {
          // We already export an error in the union type field, so just skip
          // building the union itself and it will default to an unreference
          // Binary section.
          offset += sizeof(uint32_t);
          continue;
        }

        const std::string enum_type =
            BuildUnion(union_offset, realized_type.value(), field);

        comment.default_value = "(`" + enum_type + "`)";
        regions.push_back(MakeBinaryRegion(offset, sizeof(uint32_t),
                                           BinaryRegionType::UOffset, 0,
                                           union_offset, comment));

        offset += sizeof(uint32_t);
      }
    } break;
    default: {
      if (IsScalar(field->type()->element())) {
        const BinaryRegionType binary_region_type =
            GetRegionType(field->type()->element());

        const uint64_t type_size = GetTypeSize(field->type()->element());

        // TODO(dbaileychess): It might be nicer to user the
        // BinaryRegion.array_length field to indicate this.
        for (size_t i = 0; i < vector_length.value(); ++i) {
          BinaryRegionComment vector_scalar_comment;
          vector_scalar_comment.type = BinaryRegionCommentType::VectorValue;
          vector_scalar_comment.index = i;

          if (!IsValidRead(offset, type_size)) {
            const uint64_t remaining = RemainingBytes(offset);

            SetError(vector_scalar_comment,
                     BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
                     std::to_string(type_size));

            regions.push_back(
                MakeBinaryRegion(offset, remaining, BinaryRegionType::Unknown,
                                 remaining, 0, vector_scalar_comment));
            break;
          }

          if (IsUnionType(field->type()->element())) {
            // This is a type for a union. Validate the value
            const auto enum_value = ReadScalar<uint8_t>(offset);

            // This should always have a value, due to the IsValidRead check
            // above.
            if (!IsValidUnionValue(field->type()->index(),
                                   enum_value.value())) {
              SetError(vector_scalar_comment,
                       BinaryRegionStatus::ERROR_INVALID_UNION_TYPE);
              regions.push_back(MakeBinaryRegion(offset, type_size,
                                                 binary_region_type, 0, 0,
                                                 vector_scalar_comment));
              offset += type_size;
              continue;
            }
          }

          regions.push_back(MakeBinaryRegion(offset, type_size,
                                             binary_region_type, 0, 0,
                                             vector_scalar_comment));
          offset += type_size;
        }
      }
    } break;
  }
  AddSection(vector_offset,
             MakeBinarySection(std::string(table->name()->c_str()) + "." +
                                   field->name()->c_str(),
                               section_type, std::move(regions)));
}